

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O2

AMQP_VALUE messaging_delivery_released(void)

{
  RELEASED_HANDLE released;
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  
  released = released_create();
  if (released == (RELEASED_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pAVar1 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar1 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_delivery_released",0xe7,1,"Cannot create RELEASED delivery state handle"
               );
    }
  }
  else {
    pAVar1 = amqpvalue_create_released(released);
    if (pAVar1 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                  ,"messaging_delivery_released",0xef,1,
                  "Cannot create RELEASED delivery state AMQP value");
      }
    }
    released_destroy(released);
  }
  return pAVar1;
}

Assistant:

AMQP_VALUE messaging_delivery_released(void)
{
    AMQP_VALUE result;
    RELEASED_HANDLE released = released_create();
    if (released == NULL)
    {
        LogError("Cannot create RELEASED delivery state handle");
        result = NULL;
    }
    else
    {
        result = amqpvalue_create_released(released);
        if (result == NULL)
        {
            LogError("Cannot create RELEASED delivery state AMQP value");
        }
        else
        {
            /* all ok */
        }

        released_destroy(released);
    }

    return result;
}